

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  u16 *puVar1;
  char **ppcVar2;
  VtabCtx *pVVar3;
  sqlite3_vtab *psVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  VtabCtx **ppVVar9;
  char *pcVar10;
  VTable *pVTab;
  char *pcVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  char *zErr;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iVar8 = (pTab->u).tab.addColOffset;
  zErr = (char *)0x0;
  ppcVar2 = (pTab->u).vtab.azArg;
  ppVVar9 = &db->pVtabCtx;
  do {
    pVVar3 = *ppVVar9;
    if (pVVar3 == (VtabCtx *)0x0) {
      pcVar10 = sqlite3DbStrDup(db,pTab->zName);
      iVar6 = 7;
      if (pcVar10 != (char *)0x0) {
        pVTab = (VTable *)sqlite3MallocZero(0x30);
        if (pVTab == (VTable *)0x0) {
          sqlite3OomFault(db);
          sqlite3DbFreeNN(db,pcVar10);
        }
        else {
          pVTab->db = db;
          pVTab->pMod = pMod;
          pVTab->eVtabRisk = '\x01';
          iVar6 = sqlite3SchemaToIndex(db,pTab->pSchema);
          ((pTab->u).tab.pFKey)->pNextFrom = (FKey *)db->aDb[iVar6].zDbSName;
          local_58._16_8_ = db->pVtabCtx;
          local_58._24_8_ = local_58._24_8_ & 0xffffffff00000000;
          db->pVtabCtx = (VtabCtx *)local_58;
          pTab->nTabRef = pTab->nTabRef + 1;
          local_58._0_8_ = pVTab;
          local_58._8_8_ = pTab;
          iVar6 = (*xConstruct)(db,pMod->pAux,iVar8,ppcVar2,&pVTab->pVtab,&zErr);
          sqlite3DeleteTable(db,pTab);
          db->pVtabCtx = (VtabCtx *)local_58._16_8_;
          if (iVar6 == 0) {
            psVar4 = pVTab->pVtab;
            if (psVar4 == (sqlite3_vtab *)0x0) {
              iVar6 = 0;
            }
            else {
              psVar4->zErrMsg = (char *)0x0;
              psVar4->pModule = (sqlite3_module *)0x0;
              *(undefined8 *)&psVar4->nRef = 0;
              pVTab->pVtab->pModule = pMod->pModule;
              pMod->nRefModule = pMod->nRefModule + 1;
              pVTab->nRef = 1;
              if (local_58._24_4_ == 0) {
                pcVar11 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pcVar10)
                ;
                *pzErr = pcVar11;
                sqlite3VtabUnlock(pVTab);
                iVar6 = 1;
              }
              else {
                pVTab->pNext = (VTable *)(pTab->u).tab.pDfltList;
                (pTab->u).vtab.p = pVTab;
                uVar5 = 0;
                for (lVar13 = 0; lVar13 < pTab->nCol; lVar13 = lVar13 + 1) {
                  pcVar11 = sqlite3ColumnType(pTab->aCol + lVar13,"");
                  uVar7 = sqlite3Strlen30(pcVar11);
                  uVar15 = 0;
LAB_00154fa3:
                  if (uVar7 == uVar15) {
                    uVar7 = (uint)uVar5;
                  }
                  else {
                    iVar8 = sqlite3_strnicmp("hidden",pcVar11 + uVar15,6);
                    if ((iVar8 != 0) ||
                       (((uVar15 != 0 && (pcVar11[uVar15 - 1] != ' ')) ||
                        ((pcVar11[uVar15 + 6] & 0xdfU) != 0)))) goto LAB_00154fd2;
                    lVar12 = 7 - (ulong)(pcVar11[uVar15 + 6] == 0);
                    for (uVar14 = uVar15; lVar12 + uVar14 <= (ulong)uVar7; uVar14 = uVar14 + 1) {
                      pcVar11[uVar14] = pcVar11[uVar14 + lVar12];
                    }
                    if ((uVar15 != 0) && (pcVar11[uVar15] == '\0')) {
                      pcVar11[uVar15 - 1] = '\0';
                    }
                    puVar1 = &pTab->aCol[lVar13].colFlags;
                    *puVar1 = *puVar1 | 2;
                    uVar5 = 0x400;
                    uVar7 = 2;
                  }
                  pTab->tabFlags = pTab->tabFlags | uVar7;
                }
                iVar6 = 0;
              }
            }
          }
          else {
            if (iVar6 == 7) {
              sqlite3OomFault(db);
            }
            if (zErr == (char *)0x0) {
              pcVar11 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar10);
              *pzErr = pcVar11;
            }
            else {
              pcVar11 = sqlite3MPrintf(db,"%s");
              *pzErr = pcVar11;
              sqlite3_free(zErr);
            }
            sqlite3DbFreeNN(db,pVTab);
          }
          sqlite3DbFreeNN(db,pcVar10);
        }
      }
      goto LAB_0015507e;
    }
    ppVVar9 = &pVVar3->pPrior;
  } while (pVVar3->pTab != pTab);
  pcVar10 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
  *pzErr = pcVar10;
  iVar6 = 6;
LAB_0015507e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
LAB_00154fd2:
  uVar15 = uVar15 + 1;
  goto LAB_00154fa3;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db,
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg;
  int nArg = pTab->u.vtab.nArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  assert( IsVirtual(pTab) );
  azArg = (const char *const*)pTab->u.vtab.azArg;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db,
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;
  pVTable->eVtabRisk = SQLITE_VTABRISK_Normal;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->u.vtab.azArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  pTab->nTabRef++;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  assert( pTab!=0 );
  assert( pTab->nTabRef>1 || rc!=SQLITE_OK );
  sqlite3DeleteTable(db, pTab);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pMod->nRefModule++;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, zModuleName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u16 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->u.vtab.p. Then loop through the
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->u.vtab.p;
      pTab->u.vtab.p = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          pTab->tabFlags |= TF_HasHidden;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}